

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCB.cpp
# Opt level: O1

void print_pcbs(list<PCB_*,_std::allocator<PCB_*>_> *p)

{
  int *piVar1;
  long *plVar2;
  ostream *poVar3;
  list<PCB_*,_std::allocator<PCB_*>_> *plVar4;
  string s;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  plVar4 = *(list<PCB_*,_std::allocator<PCB_*>_> **)p;
  if (plVar4 != p) {
    do {
      piVar1 = *(int **)(plVar4 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID\t",3);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Job Size:\t",10);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[1]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"JobPri:\t",8);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[2]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"InSize:\t",8);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[3]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OutSize:\t",9);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[4]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TempSize:\t",10);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[5]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total Size:\t",0xc);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,piVar1[6]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      local_48 = 0;
      local_40[0] = '\0';
      local_50 = local_40;
      if ((ulong)(uint)piVar1[7] < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_50,0,(char *)0x0,
                   (ulong)(&DAT_00108268 + *(int *)(&DAT_00108268 + (ulong)(uint)piVar1[7] * 4)));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State:\t",7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      plVar4 = *(list<PCB_*,_std::allocator<PCB_*>_> **)plVar4;
    } while (plVar4 != p);
  }
  if (*(list<PCB_*,_std::allocator<PCB_*>_> **)p == p) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No PCBs to print.",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  return;
}

Assistant:

void print_pcbs(std::list<PCB *> p)
{

    for(PCB *pcb : p)
    {
        std::cout << "ID\t" << pcb->job_id << std::endl;
        std::cout << "Job Size:\t" << pcb->job_size << std::endl;
        std::cout << "JobPri:\t" << pcb->job_pri << std::endl;
        std::cout << "InSize:\t" << pcb->in_buf_size << std::endl;
        std::cout << "OutSize:\t" << pcb->out_buf_size << std::endl;
        std::cout << "TempSize:\t" << pcb->temp_buf_size << std::endl;
        std::cout << "Total Size:\t" << pcb->total_size << std::endl;
        std::string s;
        switch((int)pcb->state)
        {
            case 0: {
                s = "RUNNING";
                break;
            }
            case 1: {
                s = "READY";
                break;
            }
            case 2: {
                s = "BLOCKED";
                break;
            }
            case 3: {
                s = "NEW";
                break;
            }
            case 4: {
                s = "COMPLETED";
                break;
            }
        }
        std::cout << "State:\t" << s << std::endl;
        std::cout << std::endl;
    }

    if (p.empty())
        std::cout << ("No PCBs to print.") << std::endl;

}